

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O1

void soplex::
     initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecset,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *facset,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *veclogs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *vecnnzinv,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  Item *pIVar1;
  byte bVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  fpclass_type fVar6;
  fpclass_type fVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  int32_t iVar11;
  pointer pnVar9;
  undefined8 uVar10;
  int32_t iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this;
  long lVar17;
  uint *puVar18;
  cpp_dec_float<200u,int,void> *pcVar19;
  undefined4 *puVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  uint *puVar22;
  uint *puVar23;
  undefined4 *puVar24;
  pointer pnVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  long lVar27;
  long lVar28;
  byte bVar29;
  double dVar30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nnzinv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  logsum;
  int local_534;
  cpp_dec_float<200U,_int,_void> local_4e8;
  undefined1 local_468 [32];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [13];
  undefined3 uStack_3fb;
  int iStack_3f8;
  bool bStack_3f4;
  undefined8 local_3f0;
  undefined1 local_3e8 [32];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [13];
  undefined3 uStack_37b;
  int iStack_378;
  bool bStack_374;
  undefined8 local_370;
  cpp_dec_float<200U,_int,_void> local_360;
  cpp_dec_float<200U,_int,_void> local_2e0;
  uint local_260 [28];
  uint local_1f0 [28];
  undefined4 local_180 [28];
  undefined4 local_110 [28];
  uint local_a0 [28];
  
  bVar29 = 0;
  lVar15 = (long)(vecset->set).thenum;
  if (0 < lVar15) {
    lVar28 = 0;
    do {
      local_370._0_4_ = cpp_dec_float_finite;
      local_370._4_4_ = 0x1c;
      local_3e8._0_16_ = (undefined1  [16])0x0;
      local_3e8._16_16_ = (undefined1  [16])0x0;
      local_3c8 = (undefined1  [16])0x0;
      local_3b8 = (undefined1  [16])0x0;
      local_3a8 = (undefined1  [16])0x0;
      local_398 = (undefined1  [16])0x0;
      local_388 = SUB1613((undefined1  [16])0x0,0);
      uStack_37b = 0;
      iStack_378 = 0;
      bStack_374 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_3e8,0.0);
      pIVar1 = (vecset->set).theitem + (vecset->set).thekey[lVar28].idx;
      iVar14 = (pIVar1->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      lVar16 = (long)iVar14;
      local_534 = 0;
      if (0 < lVar16) {
        lVar27 = 0;
        local_534 = 0;
        do {
          pNVar8 = (pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar22 = (uint *)((long)&(pNVar8->val).m_backend.data + lVar27);
          puVar18 = puVar22;
          puVar23 = local_260;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar23 = *puVar18;
            puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
            puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
          }
          iVar3 = *(int *)((long)&(pNVar8->val).m_backend.data + lVar27 + 0x70);
          bVar2 = *(byte *)((long)&(pNVar8->val).m_backend.data + lVar27 + 0x74);
          fVar4 = *(fpclass_type *)((long)&(pNVar8->val).m_backend.data + lVar27 + 0x78);
          iVar5 = *(int32_t *)((long)&(pNVar8->val).m_backend.data + lVar27 + 0x7c);
          puVar18 = local_a0;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar18 = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          }
          pnVar21 = epsilon;
          pcVar26 = &local_2e0;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pcVar26->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar26 + ((ulong)bVar29 * -2 + 1) * 4);
          }
          local_2e0.exp = (epsilon->m_backend).exp;
          local_2e0.neg = (epsilon->m_backend).neg;
          fVar6 = (epsilon->m_backend).fpclass;
          iVar11 = (epsilon->m_backend).prec_elem;
          local_2e0.fpclass = fVar6;
          local_2e0.prec_elem = iVar11;
          puVar22 = local_a0;
          pcVar26 = &local_4e8;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pcVar26->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar29 * -8 + 4);
          }
          local_4e8.prec_elem = iVar5;
          local_4e8.fpclass = fVar4;
          local_4e8.neg = (bool)bVar2;
          if ((bVar2 == 1) && (local_4e8.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
            local_4e8.neg = false;
          }
          local_4e8.exp = iVar3;
          if (fVar6 == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) {
LAB_0014b463:
            puVar22 = local_260;
            puVar18 = (uint *)local_468;
            for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
              *puVar18 = *puVar22;
              puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
              puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
            }
            local_3f0._4_4_ = iVar5;
            local_3f0._0_4_ = fVar4;
            bStack_3f4 = (bool)bVar2;
            if ((bVar2 != 0) && (fVar4 != cpp_dec_float_finite || local_468._0_4_ != 0)) {
              bStack_3f4 = (bool)(bVar2 ^ 1);
            }
            iStack_3f8 = iVar3;
            dVar30 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                               ((cpp_dec_float<200U,_int,_void> *)local_468);
            dVar30 = log2(dVar30);
            local_4e8.fpclass = cpp_dec_float_finite;
            local_4e8.prec_elem = 0x1c;
            local_4e8.data._M_elems[0] = 0;
            local_4e8.data._M_elems[1] = 0;
            local_4e8.data._M_elems[2] = 0;
            local_4e8.data._M_elems[3] = 0;
            local_4e8.data._M_elems[4] = 0;
            local_4e8.data._M_elems[5] = 0;
            local_4e8.data._M_elems[6] = 0;
            local_4e8.data._M_elems[7] = 0;
            local_4e8.data._M_elems[8] = 0;
            local_4e8.data._M_elems[9] = 0;
            local_4e8.data._M_elems[10] = 0;
            local_4e8.data._M_elems[0xb] = 0;
            local_4e8.data._M_elems[0xc] = 0;
            local_4e8.data._M_elems[0xd] = 0;
            local_4e8.data._M_elems[0xe] = 0;
            local_4e8.data._M_elems[0xf] = 0;
            local_4e8.data._M_elems[0x10] = 0;
            local_4e8.data._M_elems[0x11] = 0;
            local_4e8.data._M_elems[0x12] = 0;
            local_4e8.data._M_elems[0x13] = 0;
            local_4e8.data._M_elems[0x14] = 0;
            local_4e8.data._M_elems[0x15] = 0;
            local_4e8.data._M_elems[0x16] = 0;
            local_4e8.data._M_elems[0x17] = 0;
            local_4e8.data._M_elems[0x18] = 0;
            local_4e8.data._M_elems[0x19] = 0;
            local_4e8.data._M_elems._104_5_ = 0;
            local_4e8.data._M_elems[0x1b]._1_3_ = 0;
            local_4e8.exp = 0;
            local_4e8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_4e8,dVar30);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_3e8,&local_4e8);
            local_534 = local_534 + 1;
          }
          else {
            iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_4e8,&local_2e0);
            if (0 < iVar13) goto LAB_0014b463;
          }
          lVar27 = lVar27 + 0x84;
        } while (lVar16 * 0x84 != lVar27);
      }
      local_3f0._0_4_ = cpp_dec_float_finite;
      local_3f0._4_4_ = 0x1c;
      local_468._0_16_ = (undefined1  [16])0x0;
      local_468._16_16_ = (undefined1  [16])0x0;
      local_448 = (undefined1  [16])0x0;
      local_438 = (undefined1  [16])0x0;
      local_428 = (undefined1  [16])0x0;
      local_418 = (undefined1  [16])0x0;
      local_408 = SUB1613((undefined1  [16])0x0,0);
      uStack_3fb = 0;
      iStack_3f8 = 0;
      bStack_3f4 = false;
      if (local_534 < 1) {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_3e8,1.0);
        dVar30 = 1.0;
      }
      else {
        dVar30 = 1.0 / (double)local_534;
      }
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_468,dVar30);
      puVar20 = (undefined4 *)local_3e8;
      puVar24 = local_110;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        *puVar24 = *puVar20;
        puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
        puVar24 = puVar24 + (ulong)bVar29 * -2 + 1;
      }
      iVar3 = (veclogs->super_IdxSet).num;
      (veclogs->super_IdxSet).num = iVar3 + 1;
      pnVar9 = (veclogs->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (veclogs->super_IdxSet).idx[iVar3] = (int)lVar28;
      puVar20 = local_110;
      pnVar25 = pnVar9 + lVar28;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = *puVar20;
        puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
        pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      pnVar9[lVar28].m_backend.exp = iStack_378;
      pnVar9[lVar28].m_backend.neg = bStack_374;
      pnVar9[lVar28].m_backend.fpclass = (fpclass_type)local_370;
      pnVar9[lVar28].m_backend.prec_elem = local_370._4_4_;
      pcVar19 = (cpp_dec_float<200u,int,void> *)local_468;
      puVar20 = local_180;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        *puVar20 = *(undefined4 *)pcVar19;
        pcVar19 = pcVar19 + (ulong)bVar29 * -8 + 4;
        puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
      }
      iVar3 = (vecnnzinv->super_IdxSet).num;
      (vecnnzinv->super_IdxSet).num = iVar3 + 1;
      pnVar9 = (vecnnzinv->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (vecnnzinv->super_IdxSet).idx[iVar3] = (int)lVar28;
      puVar20 = local_180;
      pnVar25 = pnVar9 + lVar28;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = *puVar20;
        puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
        pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      pnVar9[lVar28].m_backend.exp = iStack_3f8;
      pnVar9[lVar28].m_backend.neg = bStack_3f4;
      pnVar9[lVar28].m_backend.fpclass = (fpclass_type)local_3f0;
      pnVar9[lVar28].m_backend.prec_elem = local_3f0._4_4_;
      this = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::create(facset,local_534);
      if (0 < iVar14) {
        lVar27 = 0;
        do {
          pNVar8 = (pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar22 = (uint *)((long)&(pNVar8->val).m_backend.data + lVar27);
          puVar18 = local_1f0;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar18 = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          }
          iVar14 = *(int *)((long)&(pNVar8->val).m_backend.data + lVar27 + 0x70);
          bVar2 = *(byte *)((long)&(pNVar8->val).m_backend.data + lVar27 + 0x74);
          uVar10 = *(undefined8 *)((long)&(pNVar8->val).m_backend.data + lVar27 + 0x78);
          pnVar21 = epsilon;
          pcVar26 = &local_360;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pcVar26->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar26 + ((ulong)bVar29 * -2 + 1) * 4);
          }
          local_360.exp = (epsilon->m_backend).exp;
          local_360.neg = (epsilon->m_backend).neg;
          fVar7 = (epsilon->m_backend).fpclass;
          iVar12 = (epsilon->m_backend).prec_elem;
          local_360.fpclass = fVar7;
          local_360.prec_elem = iVar12;
          puVar22 = local_1f0;
          pcVar26 = &local_4e8;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pcVar26->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar29 * -8 + 4);
          }
          local_4e8.neg = (bool)bVar2;
          if ((bVar2 == 1) &&
             (local_4e8.data._M_elems[0] != 0 || (fpclass_type)uVar10 != cpp_dec_float_finite)) {
            local_4e8.neg = false;
          }
          local_4e8.exp = iVar14;
          local_4e8._120_8_ = uVar10;
          if (fVar7 == cpp_dec_float_NaN || (fpclass_type)uVar10 == cpp_dec_float_NaN) {
LAB_0014b829:
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(this,*(int *)((long)(&((pIVar1->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar27),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_468);
          }
          else {
            iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_4e8,&local_360);
            if (0 < iVar14) goto LAB_0014b829;
          }
          lVar27 = lVar27 + 0x84;
        } while (lVar16 * 0x84 != lVar27);
      }
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::sort(this);
      lVar28 = lVar28 + 1;
    } while (lVar28 != lVar15);
  }
  return;
}

Assistant:

static void initConstVecs(
   const SVSetBase<R>* vecset,
   SVSetBase<R>& facset,
   SSVectorBase<R>& veclogs,
   SSVectorBase<R>& vecnnzinv,
   R epsilon)
{
   assert(vecset != nullptr);

   const int nvec = vecset->num();

   for(int k = 0; k < nvec; ++k)
   {
      R logsum = 0.0;
      int nnz = 0;
      // get kth row or column of LP
      const SVectorBase<R>& lpvec = (*vecset)[k];
      const int size = lpvec.size();

      for(int i = 0; i < size; ++i)
      {
         const R a = lpvec.value(i);

         if(!isZero(a, epsilon))
         {
            logsum += log2(double(spxAbs(a))); // todo spxLog2?
            nnz++;
         }
      }

      R nnzinv;

      if(nnz > 0)
      {
         nnzinv = 1.0 / nnz;
      }
      else
      {
         /* all-0 entries */
         logsum = 1.0;
         nnzinv = 1.0;
      }

      veclogs.add(k, logsum);
      vecnnzinv.add(k, nnzinv);

      /* create new VectorBase<R> for facset */
      SVectorBase<R>& vecnew = (*(facset.create(nnz)));

      for(int i = 0; i < size; ++i)
      {
         if(!isZero(lpvec.value(i), epsilon))
            vecnew.add(lpvec.index(i), nnzinv);
      }

      vecnew.sort();
   }

   assert(veclogs.isSetup());
   assert(vecnnzinv.isSetup());
}